

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QDir *dir)

{
  uint uVar1;
  QDirPrivate *pQVar2;
  long lVar3;
  int *piVar4;
  QSharedDataPointer<QDirPrivate> QVar5;
  storage_type *in_RCX;
  storage_type *psVar6;
  uint *puVar7;
  long *in_RDX;
  char16_t *begin;
  uint uVar8;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView other_00;
  QLatin1StringView other_01;
  QLatin1StringView other_02;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QByteArrayView ba_07;
  QByteArrayView ba_08;
  QDebugStateSaver save;
  QDebugStateSaver save_1;
  QArrayDataPointer<QString> local_128;
  QString local_110;
  QString local_f8;
  QSharedDataPointer<QDirPrivate> local_e0;
  totally_ordered_wrapper<QDirPrivate_*> local_d8;
  QDebug local_d0;
  QDebug local_c8;
  QDebugStateSaver local_c0;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QDebugStateSaver local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_c0,(QDebug *)dir);
  QDebug::resetFormat((QDebug *)dir);
  pQVar2 = (dir->d_ptr).d.ptr;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QDir(";
  QString::fromUtf8(&local_58,(QString *)0x5,ba);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_58);
  piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
    }
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar2->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  QFileSystemEntry::filePath(&local_f8,(QFileSystemEntry *)(*in_RDX + 0x30));
  if ((QChar *)local_f8.d.ptr == (QChar *)0x0) {
    local_f8.d.ptr = L"";
  }
  QDebug::putString((QDebug *)dir,(QChar *)local_f8.d.ptr,local_f8.d.size);
  pQVar2 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar2->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)", nameFilters = {";
  QString::fromUtf8(&local_58,(QString *)0x11,ba_00);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_58);
  piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
    }
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar2->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  lVar3 = *in_RDX;
  local_128.d = *(Data **)(lVar3 + 8);
  local_128.ptr = *(QString **)(lVar3 + 0x10);
  local_128.size = *(qsizetype *)(lVar3 + 0x18);
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d.d._0_2_ = 0x2c;
  psVar6 = (storage_type *)0x1;
  QtPrivate::QStringList_join(&local_110,(QStringList *)&local_128,(QChar *)&local_58,1);
  if ((QChar *)local_110.d.ptr == (QChar *)0x0) {
    local_110.d.ptr = L"";
  }
  QDebug::putString((QDebug *)dir,(QChar *)local_110.d.ptr,local_110.d.size);
  pQVar2 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar2->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  ba_01.m_data = psVar6;
  ba_01.m_size = (qsizetype)"}, ";
  QString::fromUtf8(&local_58,(QString *)0x3,ba_01);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_58);
  piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
    }
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  if (*(char *)&(pQVar2->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  local_e0.d.ptr = (totally_ordered_wrapper<QDirPrivate_*>)(dir->d_ptr).d.ptr;
  *(int *)&(((QDirPrivate *)local_e0.d.ptr)->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false> =
       *(int *)&(((QDirPrivate *)local_e0.d.ptr)->fileEngine)._M_t.
                super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                ._M_t.
                super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                .super__Head_base<0UL,_QAbstractFileEngine_*,_false> + 1;
  uVar1 = *(uint *)(*in_RDX + 0x20);
  local_60.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_60,(QDebug *)&local_e0);
  QDebug::resetFormat((QDebug *)&local_e0);
  QVar5.d.ptr = local_e0.d.ptr;
  if (uVar1 == 0xffffffff) {
    ba_08.m_data = psVar6;
    ba_08.m_size = (qsizetype)"QDir::SortFlags(NoSort)";
    QString::fromUtf8(&local_58,(QString *)0x17,ba_08);
    QTextStream::operator<<((QTextStream *)QVar5.d.ptr,&local_58);
    piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10)
        ;
      }
    }
    if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
      QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
    }
    goto LAB_0022a91d;
  }
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  uVar8 = uVar1 & 3;
  puVar7 = (uint *)((long)&switchD_0022a3e5::switchdataD_004da3a0 +
                   (long)(int)(&switchD_0022a3e5::switchdataD_004da3a0)[uVar8]);
  switch(uVar8) {
  case 0:
    other.m_data = "Name";
    other.m_size = 4;
    QString::operator=(&local_78,other);
    puVar7 = &switchD_0022a412::switchdataD_004da3b0;
    switch(uVar8) {
    case 0:
      goto switchD_0022a412_caseD_0;
    case 1:
      goto switchD_0022a3e5_caseD_1;
    case 2:
      goto switchD_0022a3e5_caseD_2;
    }
    break;
  case 1:
switchD_0022a3e5_caseD_1:
    other_00.m_data = "Time";
    other_00.m_size = 4;
    QString::operator=(&local_78,other_00);
    if (uVar8 != 3) {
      if (uVar8 != 2) goto switchD_0022a412_caseD_0;
      goto switchD_0022a3e5_caseD_2;
    }
    break;
  case 2:
switchD_0022a3e5_caseD_2:
    other_01.m_data = "Size";
    other_01.m_size = 4;
    QString::operator=(&local_78,other_01);
    if (uVar8 == 3) break;
    goto switchD_0022a412_caseD_0;
  }
  other_02.m_data = "Unsorted";
  other_02.m_size = 8;
  QString::operator=(&local_78,other_02);
switchD_0022a412_caseD_0:
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  if ((uVar1 & 4) != 0) {
    ba_02.m_data = (storage_type *)puVar7;
    ba_02.m_size = (qsizetype)"DirsFirst";
    QString::fromLatin1(&local_58,(QString *)0x9,ba_02);
    local_b8.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_b8);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar1 & 0x20) != 0) {
    ba_03.m_data = (storage_type *)puVar7;
    ba_03.m_size = (qsizetype)"DirsLast";
    QString::fromLatin1(&local_58,(QString *)0x8,ba_03);
    local_b8.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_b8);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar1 & 0x10) != 0) {
    ba_04.m_data = (storage_type *)puVar7;
    ba_04.m_size = (qsizetype)"IgnoreCase";
    QString::fromLatin1(&local_58,(QString *)0xa,ba_04);
    local_b8.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_b8);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar1 & 0x40) != 0) {
    ba_05.m_data = (storage_type *)puVar7;
    ba_05.m_size = (qsizetype)"LocaleAware";
    QString::fromLatin1(&local_58,(QString *)0xb,ba_05);
    local_b8.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_b8);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((char)uVar1 < '\0') {
    ba_06.m_data = (storage_type *)puVar7;
    ba_06.m_size = (qsizetype)"Type";
    QString::fromLatin1(&local_58,(QString *)0x4,ba_06);
    local_b8.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
    local_b8.d.ptr = local_58.d.ptr;
    local_b8.d.size = local_58.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_b8);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QVar5.d.ptr = local_e0.d.ptr;
  *(undefined1 *)((long)local_e0.d.ptr + 0x31) = 1;
  ba_07.m_data = (storage_type *)puVar7;
  ba_07.m_size = (qsizetype)"QDir::SortFlags(";
  QString::fromUtf8(&local_58,(QString *)0x10,ba_07);
  QTextStream::operator<<((QTextStream *)QVar5.d.ptr,&local_58);
  piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
    }
  }
  if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
  }
  begin = local_78.d.ptr;
  if ((QChar *)local_78.d.ptr == (QChar *)0x0) {
    begin = L"";
  }
  QDebug::putString((QDebug *)&local_e0,(QChar *)begin,local_78.d.size);
  if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
  }
  QTextStream::operator<<((QTextStream *)local_e0.d.ptr,'|');
  if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
  }
  local_b8.d.d = (Data *)CONCAT62(local_b8.d.d._2_6_,0x7c);
  QtPrivate::QStringList_join(&local_58,(QStringList *)&local_98,(QChar *)&local_b8,1);
  if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
    local_58.d.ptr = L"";
  }
  QDebug::putString((QDebug *)&local_e0,(QChar *)local_58.d.ptr,local_58.d.size);
  if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
  }
  QTextStream::operator<<((QTextStream *)local_e0.d.ptr,')');
  if (*(char *)&(((QFileSystemEntry *)((long)local_e0.d.ptr + 0x30))->m_filePath).d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_e0.d.ptr,' ');
  }
  piVar4 = (int *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT62(local_58.d.d._2_6_,local_58.d.d._0_2_),2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0022a91d:
  local_d8 = local_e0.d.ptr;
  local_e0.d.ptr = (totally_ordered_wrapper<QDirPrivate_*>)(QDirPrivate *)0x0;
  QDebugStateSaver::~QDebugStateSaver(&local_60);
  QTextStream::operator<<((QTextStream *)local_d8.ptr,',');
  if (*(char *)&((local_d8.ptr)->dirEntry).m_filePath.d.d == '\x01') {
    QTextStream::operator<<((QTextStream *)local_d8.ptr,' ');
  }
  local_d0.stream = (Stream *)local_d8.ptr;
  *(int *)&((local_d8.ptr)->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       *(int *)&((local_d8.ptr)->fileEngine)._M_t.
                super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                ._M_t.
                super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl + 1;
  operator<<((Stream *)&local_c8,(QFlagsStorageHelper<QDir::Filter,_4>)SUB84(&local_d0,0));
  QTextStream::operator<<(&(local_c8.stream)->ts,')');
  if ((local_c8.stream)->space == true) {
    QTextStream::operator<<(&(local_c8.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_c8);
  QDebug::~QDebug(&local_d0);
  QDebug::~QDebug((QDebug *)&local_d8);
  QDebug::~QDebug((QDebug *)&local_e0);
  if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_128);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (dir->d_ptr).d.ptr;
  (dir->d_ptr).d.ptr = (QDirPrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDir &dir)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    debug << "QDir(" << dir.path() << ", nameFilters = {"
          << dir.nameFilters().join(u',')
          << "}, "
          << dir.sorting()
          << ','
          << dir.filter()
          << ')';
    return debug;
}